

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

void __thiscall Expression::adjustOperators(Expression *this)

{
  bool bVar1;
  reference ppEVar2;
  ExpressionSymbolType *pEVar3;
  ExpressionOperatorType *pEVar4;
  ExpressionOperatorType local_99;
  _Self local_98;
  ExpressionOperator *local_78;
  ExpressionOperator *op;
  Iterator local_50;
  undefined1 local_30 [8];
  _Self it;
  Expression *this_local;
  
  it._M_node = (_Map_pointer)this;
  List<ExpressionSymbol_*>::begin(&local_50,&this->m_symbols);
  std::operator+((_Self *)local_30,&local_50,1);
  while( true ) {
    List<ExpressionSymbol_*>::end((Iterator *)&op,&this->m_symbols);
    bVar1 = std::operator!=((_Self *)local_30,(_Self *)&op);
    if (!bVar1) break;
    ppEVar2 = std::_Deque_iterator<ExpressionSymbol_*,_ExpressionSymbol_*&,_ExpressionSymbol_**>::
              operator*((_Deque_iterator<ExpressionSymbol_*,_ExpressionSymbol_*&,_ExpressionSymbol_**>
                         *)local_30);
    pEVar3 = ExpressionSymbol::type(*ppEVar2);
    if (*pEVar3 == EXPRSYM_Operator) {
      ppEVar2 = std::_Deque_iterator<ExpressionSymbol_*,_ExpressionSymbol_*&,_ExpressionSymbol_**>::
                operator*((_Deque_iterator<ExpressionSymbol_*,_ExpressionSymbol_*&,_ExpressionSymbol_**>
                           *)local_30);
      local_78 = (ExpressionOperator *)*ppEVar2;
      pEVar4 = ExpressionOperator::id(local_78);
      bVar1 = false;
      if (*pEVar4 == OPER_UnaryMinus) {
        std::operator-(&local_98,(_Self *)local_30,1);
        ppEVar2 = std::_Deque_iterator<ExpressionSymbol_*,_ExpressionSymbol_*&,_ExpressionSymbol_**>
                  ::operator*(&local_98);
        pEVar3 = ExpressionSymbol::type(*ppEVar2);
        bVar1 = *pEVar3 == EXPRSYM_Value;
      }
      if (bVar1) {
        local_99 = OPER_Subtraction;
        ExpressionOperator::setID(local_78,&local_99);
      }
    }
    std::_Deque_iterator<ExpressionSymbol_*,_ExpressionSymbol_*&,_ExpressionSymbol_**>::operator++
              ((_Deque_iterator<ExpressionSymbol_*,_ExpressionSymbol_*&,_ExpressionSymbol_**> *)
               local_30);
  }
  return;
}

Assistant:

void Expression::adjustOperators()
{
	for (auto it = m_symbols.begin() + 1; it != m_symbols.end(); ++it)
	{
		if ((*it)->type() != EXPRSYM_Operator)
			continue;

		ExpressionOperator* op = static_cast<ExpressionOperator*> (*it);

		// Unary minus with a value as the previous symbol cannot really be
		// unary; replace with binary minus.
		if (op->id() == OPER_UnaryMinus and (*(it - 1))->type() == EXPRSYM_Value)
			op->setID (OPER_Subtraction);
	}
}